

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double * normal_01_vector(int n,int *seed)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  ulong uVar4;
  double *pdVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  int x_lo;
  int x_hi;
  double *x;
  double *r;
  double r8_pi;
  int m;
  int i;
  int *seed_local;
  int n_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)n;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pdVar5 = (double *)operator_new__(uVar4);
  if (n == 1) {
    pdVar6 = r8vec_uniform_01_new(2,seed);
    dVar7 = log(*pdVar6);
    dVar7 = sqrt(dVar7 * -2.0);
    dVar8 = cos(pdVar6[1] * 6.283185307179586);
    *pdVar5 = dVar7 * dVar8;
    if (pdVar6 != (double *)0x0) {
      operator_delete__(pdVar6);
    }
  }
  else if (n % 2 == 0) {
    pdVar6 = r8vec_uniform_01_new(n / 2 << 1,seed);
    for (r8_pi._4_4_ = 0; r8_pi._4_4_ <= (n / 2) * 2 + -2; r8_pi._4_4_ = r8_pi._4_4_ + 2) {
      dVar7 = log(pdVar6[r8_pi._4_4_]);
      dVar7 = sqrt(dVar7 * -2.0);
      dVar8 = cos(pdVar6[r8_pi._4_4_ + 1] * 6.283185307179586);
      pdVar5[r8_pi._4_4_] = dVar7 * dVar8;
      dVar7 = log(pdVar6[r8_pi._4_4_]);
      dVar7 = sqrt(dVar7 * -2.0);
      dVar8 = sin(pdVar6[r8_pi._4_4_ + 1] * 6.283185307179586);
      pdVar5[r8_pi._4_4_ + 1] = dVar7 * dVar8;
    }
    if (pdVar6 != (double *)0x0) {
      operator_delete__(pdVar6);
    }
  }
  else {
    iVar2 = (n + -1) / 2 + 1;
    pdVar6 = r8vec_uniform_01_new(iVar2 * 2,seed);
    for (r8_pi._4_4_ = 0; r8_pi._4_4_ <= iVar2 * 2 + -4; r8_pi._4_4_ = r8_pi._4_4_ + 2) {
      dVar7 = log(pdVar6[r8_pi._4_4_]);
      dVar7 = sqrt(dVar7 * -2.0);
      dVar8 = cos(pdVar6[r8_pi._4_4_ + 1] * 6.283185307179586);
      pdVar5[r8_pi._4_4_] = dVar7 * dVar8;
      dVar7 = log(pdVar6[r8_pi._4_4_]);
      dVar7 = sqrt(dVar7 * -2.0);
      dVar8 = sin(pdVar6[r8_pi._4_4_ + 1] * 6.283185307179586);
      pdVar5[r8_pi._4_4_ + 1] = dVar7 * dVar8;
    }
    iVar3 = iVar2 * 2 + -2;
    dVar7 = log(pdVar6[iVar3]);
    dVar7 = sqrt(dVar7 * -2.0);
    dVar8 = cos(pdVar6[iVar2 * 2 + -1] * 6.283185307179586);
    pdVar5[iVar3] = dVar7 * dVar8;
    if (pdVar6 != (double *)0x0) {
      operator_delete__(pdVar6);
    }
  }
  return pdVar5;
}

Assistant:

double *normal_01_vector ( int n, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    NORMAL_01_VECTOR samples the standard normal probability distribution.
//
//  Discussion:
//
//    The standard normal probability distribution function (PDF) has
//    mean 0 and standard deviation 1.
//
//    This routine can generate a vector of values on one call.  It
//    has the feature that it should provide the same results
//    in the same order no matter how we break up the task.
//
//    Before calling this routine, the user may call RANDOM_SEED
//    in order to set the seed of the random number generator.
//
//    The Box-Muller method is used.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    26 August 2013
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of values desired.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double X(N), a sample of the standard normal PDF.
//
//  Local parameters:
//
//    Local, real R(N+1), is used to store some uniform random values.
//    Its dimension is N+1, but really it is only needed to be the
//    smallest even number greater than or equal to N.
//
//    Local, int X_LO, X_HI, records the range of entries of
//    X that we need to compute.  This starts off as 1:N, but is adjusted
//    if we have a saved value that can be immediately stored in X(1),
//    and so on.
//
{
  int i;
  int m;
  const double r8_pi = 3.14159265358979323;
  double *r;
  double *x;
  int x_hi;
  int x_lo;

  x = new double[n];
//
//  Record the range of X we need to fill in.
//
  x_lo = 1;
  x_hi = n;
//
//  If we need just one new value, do that here to avoid null arrays.
//
  if ( x_hi - x_lo + 1 == 1 )
  {
    r = r8vec_uniform_01_new ( 2, seed );

    x[x_hi-1] = sqrt ( -2.0 * log ( r[0] ) ) * cos ( 2.0 * r8_pi * r[1] );

    delete [] r;
  }
//
//  If we require an even number of values, that's easy.
//
  else if ( ( x_hi - x_lo + 1 ) % 2 == 0 )
  {
    m = ( x_hi - x_lo + 1 ) / 2;

    r = r8vec_uniform_01_new ( 2*m, seed );

    for ( i = 0; i <= 2*m-2; i = i + 2 )
    {
      x[x_lo+i-1] = sqrt ( -2.0 * log ( r[i] ) ) * cos ( 2.0 * r8_pi * r[i+1] );
      x[x_lo+i  ] = sqrt ( -2.0 * log ( r[i] ) ) * sin ( 2.0 * r8_pi * r[i+1] );
    }

    delete [] r;
  }
//
//  If we require an odd number of values, we generate an even number,
//  and handle the last pair specially, storing one in X(N).
//
  else
  {
    x_hi = x_hi - 1;

    m = ( x_hi - x_lo + 1 ) / 2 + 1;

    r = r8vec_uniform_01_new ( 2*m, seed );

    for ( i = 0; i <= 2*m-4; i = i + 2 )
    {
      x[x_lo+i-1] = sqrt ( -2.0 * log ( r[i] ) ) * cos ( 2.0 * r8_pi * r[i+1] );
      x[x_lo+i  ] = sqrt ( -2.0 * log ( r[i] ) ) * sin ( 2.0 * r8_pi * r[i+1] );
    }

    i = 2*m - 2;

    x[x_lo+i-1] = sqrt ( -2.0 * log ( r[i] ) ) * cos ( 2.0 * r8_pi * r[i+1] );

    delete [] r;
  }

  return x;
}